

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_recip_length_weights
          (Omega_h *this,Mesh *mesh,Adj *surf_verts2edges,LOs *edge2surf_edge)

{
  LO size_in;
  void *extraout_RDX;
  Reals RVar1;
  Read<double> local_108;
  Read<int> local_f8;
  Write<double> local_e8;
  Write<double> local_d8;
  undefined1 local_c8 [8];
  Reals edge2weight;
  type f;
  string local_80 [32];
  undefined1 local_60 [8];
  Write<double> edge2weight_w;
  undefined1 local_38 [4];
  LO nedges;
  Reals edge2len;
  LOs *edge2surf_edge_local;
  Adj *surf_verts2edges_local;
  Mesh *mesh_local;
  
  edge2len.write_.shared_alloc_.direct_ptr = edge2surf_edge;
  measure_edges_real((Omega_h *)local_38,mesh);
  size_in = Mesh::nedges(mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_80,"",(allocator *)((long)&f.edge2len.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_60,size_in,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.edge2len.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)&edge2weight.write_.shared_alloc_.direct_ptr,edge2surf_edge);
  Write<double>::Write
            ((Write<double> *)&f.edge2surf_edge.write_.shared_alloc_.direct_ptr,
             (Write<double> *)local_60);
  Read<double>::Read((Read<double> *)&f.edge2weight_w.shared_alloc_.direct_ptr,
                     (Read<double> *)local_38);
  parallel_for<Omega_h::get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::__0>
            (size_in,(type *)&edge2weight.write_.shared_alloc_.direct_ptr,"get_recip_length_weights"
            );
  Write<double>::Write(&local_d8,(Write<double> *)local_60);
  Read<double>::Read((Read<double> *)local_c8,&local_d8);
  Write<double>::~Write(&local_d8);
  Read<int>::Read(&local_f8,&(surf_verts2edges->super_Graph).ab2b);
  Read<double>::Read(&local_108,(Read<double> *)local_c8);
  unmap<double>((Omega_h *)&local_e8,&local_f8,(Read<signed_char> *)&local_108,1);
  Read<double>::Read((Read<double> *)this,&local_e8);
  Write<double>::~Write(&local_e8);
  Read<double>::~Read(&local_108);
  Read<int>::~Read(&local_f8);
  Read<double>::~Read((Read<double> *)local_c8);
  get_recip_length_weights(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&edge2weight.write_.shared_alloc_.direct_ptr);
  Write<double>::~Write((Write<double> *)local_60);
  Read<double>::~Read((Read<double> *)local_38);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals get_recip_length_weights(
    Mesh* mesh, Adj surf_verts2edges, LOs edge2surf_edge) {
  auto edge2len = measure_edges_real(mesh);
  auto nedges = mesh->nedges();
  auto edge2weight_w = Write<Real>(nedges);
  auto f = OMEGA_H_LAMBDA(LO edge) {
    if (edge2surf_edge[edge] == -1)
      edge2weight_w[edge] = 0.0;
    else
      edge2weight_w[edge] = 1.0 / edge2len[edge];
  };
  parallel_for(nedges, f, "get_recip_length_weights");
  auto edge2weight = Reals(edge2weight_w);
  return unmap(surf_verts2edges.ab2b, edge2weight, 1);
}